

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

bool __thiscall
prevector<8U,_int,_unsigned_int,_int>::operator==
          (prevector<8U,_int,_unsigned_int,_int> *this,prevector<8U,_int,_unsigned_int,_int> *other)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  uVar3 = other->_size;
  uVar5 = uVar3 - 9;
  if (uVar3 < 9) {
    uVar5 = uVar3;
  }
  uVar4 = this->_size;
  uVar6 = uVar4 - 9;
  if (uVar4 < 9) {
    uVar6 = uVar4;
  }
  if (uVar5 == uVar6) {
    if (8 < uVar4) {
      this = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    }
    bVar8 = uVar6 == 0;
    if (!bVar8) {
      if (8 < uVar3) {
        other = (prevector<8U,_int,_unsigned_int,_int> *)(other->_union).indirect_contents.indirect;
      }
      if (*(int *)&this->_union == *(int *)&other->_union) {
        lVar7 = 4;
        do {
          bVar8 = (long)(int)uVar6 * 4 == lVar7;
          if (bVar8) break;
          piVar1 = (int *)((long)&this->_union + lVar7);
          piVar2 = (int *)((long)&other->_union + lVar7);
          lVar7 = lVar7 + 4;
        } while (*piVar1 == *piVar2);
      }
    }
  }
  else {
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool operator==(const prevector<N, T, Size, Diff>& other) const {
        if (other.size() != size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) != (*b2)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return true;
    }